

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::interpretSpecialMessageBitShift(StackInterpreter *this)

{
  bool bVar1;
  anon_union_8_4_0eb573b0_for_Oop_0 *paVar2;
  SmallIntegerValue SVar3;
  SmallIntegerValue SVar4;
  Oop object;
  SmallIntegerValue local_50;
  SmallIntegerValue result;
  SmallIntegerValue ib;
  SmallIntegerValue ia;
  Oop b;
  Oop a;
  StackInterpreter *this_local;
  
  paVar2 = &stackOopAt(this,1)->field_0;
  b.field_0 = *paVar2;
  paVar2 = &stackOopAt(this,0)->field_0;
  ia = paVar2->intValue;
  bVar1 = Oop::isSmallInteger(&b);
  if ((bVar1) && (bVar1 = Oop::isSmallInteger((Oop *)&ia), bVar1)) {
    fetchNextInstructionOpcode(this);
    popMultiplesOops(this,2);
    SVar3 = Oop::decodeSmallInteger(&b);
    SVar4 = Oop::decodeSmallInteger((Oop *)&ia);
    if (SVar4 < 1) {
      local_50 = SVar3 >> (-(byte)SVar4 & 0x3f);
    }
    else {
      local_50 = SVar3 << ((byte)SVar4 & 0x3f);
    }
    object = Oop::encodeSmallInteger(local_50);
    pushOop(this,object);
  }
  else {
    sendSpecialArgumentCount(this,BitShift,1);
  }
  return;
}

Assistant:

void interpretSpecialMessageBitShift()
    {
        Oop a = stackOopAt(1);
        Oop b = stackOopAt(0);

        if(a.isSmallInteger() && b.isSmallInteger())
        {
            fetchNextInstructionOpcode();
            popMultiplesOops(2);

            auto ia = a.decodeSmallInteger();
            auto ib = b.decodeSmallInteger();
            auto result = ib > 0 ? ia << ib : ia >> (-ib);
            pushOop(Oop::encodeSmallInteger(result));
        }
        else
        {
            sendSpecialArgumentCount(SpecialMessageSelector::BitShift, 1);
        }

    }